

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O3

curi_status
parse_full_uri(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  ulong uVar1;
  void *pvVar2;
  curi_settings *pcVar3;
  size_t sVar4;
  byte bVar5;
  _func_int_void_ptr_char_ptr_size_t *p_Var6;
  _func_int_void_ptr_uint *p_Var7;
  size_t sVar8;
  int iVar9;
  curi_status cVar10;
  curi_status cVar11;
  uint uVar12;
  ulong uVar13;
  curi_settings *pcVar14;
  char *pcVar15;
  curi_settings *pcVar16;
  curi_settings *pcVar17;
  curi_settings *pcVar18;
  byte *pbVar19;
  long lVar20;
  size_t sVar21;
  void *pvVar22;
  size_t __TRY_initialOffset_3;
  void *pvVar23;
  size_t __TRY_initialOffset;
  ulong uVar24;
  char *pcVar25;
  void *userData_00;
  bool bVar26;
  size_t initialOffset_1;
  
  uVar24 = *offset;
  pbVar19 = (byte *)"";
  if (uVar24 < len) {
    pbVar19 = (byte *)(uri + uVar24);
  }
  *offset = uVar24 + 1;
  if (0x39 < *pbVar19 - 0x41) {
    return curi_status_error;
  }
  if ((0x3ffffff03ffffffU >> ((ulong)(*pbVar19 - 0x41) & 0x3f) & 1) == 0) {
    return curi_status_error;
  }
  lVar20 = -1;
  uVar13 = uVar24 + 1;
  do {
    pcVar25 = uri + uVar13;
    if (len <= uVar13) {
      pcVar25 = "";
    }
    *offset = uVar13 + 1;
    switch(*pcVar25) {
    case '+':
    case '-':
    case '.':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
    case 'A':
    case 'B':
    case 'C':
    case 'D':
    case 'E':
    case 'F':
    case 'G':
    case 'H':
    case 'I':
    case 'J':
    case 'K':
    case 'L':
    case 'M':
    case 'N':
    case 'O':
    case 'P':
    case 'Q':
    case 'R':
    case 'S':
    case 'T':
    case 'U':
    case 'V':
    case 'W':
    case 'X':
    case 'Y':
    case 'Z':
    case 'a':
    case 'b':
    case 'c':
    case 'd':
    case 'e':
    case 'f':
    case 'g':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
    case 's':
    case 't':
    case 'u':
    case 'v':
    case 'w':
    case 'x':
    case 'y':
    case 'z':
      lVar20 = lVar20 + -1;
      uVar13 = uVar13 + 1;
      break;
    default:
      goto switchD_001ac7f3_caseD_2c;
    }
  } while( true );
switchD_001ac8de_caseD_22:
  *offset = (size_t)pvVar2;
  if (*pcVar25 == '@') {
    pcVar25 = uri + (long)pvVar23;
    sVar21 = (long)userData_00 - (long)pvVar23;
    p_Var6 = settings->userinfo_callback;
    if (settings->url_decode == 0) {
      bVar26 = userData_00 != pvVar23;
      pvVar23 = pvVar2;
      if (p_Var6 != (_func_int_void_ptr_char_ptr_size_t *)0x0 && bVar26) {
        iVar9 = (*p_Var6)(userData,pcVar25,sVar21);
        cVar10 = (curi_status)(iVar9 == 0);
        goto LAB_001acc1e;
      }
    }
    else {
      userData_00 = userData;
      cVar10 = handle_str_callback_url_decoded(p_Var6,pcVar25,sVar21,settings,userData);
      if (cVar10 != curi_status_error) {
LAB_001acc1e:
        if (cVar10 != curi_status_success) {
          return curi_status_canceled;
        }
        pvVar23 = (void *)*offset;
      }
    }
  }
  pcVar18 = (curi_settings *)(uri + (long)pvVar23);
  pcVar14 = (curi_settings *)"";
  if (pvVar23 < len) {
    pcVar14 = pcVar18;
  }
  pcVar3 = (curi_settings *)((long)pvVar23 + 1);
  *offset = (size_t)pcVar3;
  pcVar25 = (char *)pcVar18;
  if (*(char *)&pcVar14->allocate == '[') {
    pcVar25 = uri + (long)pcVar3;
    if (len <= pcVar3) {
      pcVar25 = "";
    }
    pcVar14 = (curi_settings *)((long)pvVar23 + 2);
    *offset = (size_t)pcVar14;
    pcVar16 = pcVar14;
    if (*(char *)&((curi_settings *)pcVar25)->allocate == ':') {
LAB_001aca15:
      pcVar15 = uri + (long)pcVar16;
      if (len <= pcVar16) {
        pcVar15 = "";
      }
      pcVar17 = (curi_settings *)((long)&pcVar16->allocate + 1);
      *offset = (size_t)pcVar17;
      if (*pcVar15 != ':') {
LAB_001aca2b:
        *offset = (size_t)pcVar3;
        pcVar17 = pcVar3;
      }
      cVar11 = curi_status_success;
      lVar20 = 6;
      pcVar16 = pcVar17;
      do {
        sVar21 = *offset;
        cVar10 = parse_h16_and_colon(uri,len,offset,pcVar16,userData_00);
        if (cVar10 == curi_status_error) {
          *offset = sVar21;
          cVar10 = cVar11;
        }
        cVar11 = cVar10;
        lVar20 = lVar20 + -1;
      } while (lVar20 != 0);
      if (cVar11 == curi_status_error) {
LAB_001acad0:
        *offset = (size_t)pcVar17;
        cVar11 = parse_h16(uri,len,offset,pcVar16,userData_00);
        if (cVar11 == curi_status_error) {
          *offset = (size_t)pcVar14;
          if (*(char *)&((curi_settings *)pcVar25)->allocate == 'v') {
            pcVar15 = uri + (long)pcVar14;
            if (len <= pcVar14) {
              pcVar15 = "";
            }
            uVar13 = (long)pvVar23 + 3;
            *offset = uVar13;
            pcVar25 = (char *)(ulong)((byte)*pcVar15 - 0x30);
            if (((byte)*pcVar15 - 0x30 < 0x37) &&
               ((0x7e0000007e03ffU >> ((ulong)pcVar25 & 0x3f) & 1) != 0)) {
              pcVar25 = uri + uVar13;
              if (len <= uVar13) {
                pcVar25 = "";
              }
              uVar13 = (long)pvVar23 + 4;
              *offset = uVar13;
              if (*(char *)&((curi_settings *)pcVar25)->allocate == '.') {
                cVar10 = parse_unreserved(uri,len,offset,(curi_settings *)pcVar25,userData_00);
                if (cVar10 == curi_status_success) {
LAB_001acba9:
                  do {
                    uVar13 = *offset;
                    cVar10 = parse_unreserved(uri,len,offset,(curi_settings *)pcVar25,userData_00);
                    if (cVar10 == curi_status_error) {
                      pcVar15 = uri + uVar13;
                      if (len <= uVar13) {
                        pcVar15 = "";
                      }
                      userData_00 = (void *)(uVar13 + 1);
                      *offset = (size_t)userData_00;
                      if (0x1c < (byte)(*pcVar15 - 0x21U)) goto LAB_001acc47;
                      cVar10 = curi_status_success;
                      pcVar25 = (char *)0x16000fe9;
                      if ((0x16000fe9U >> ((byte)(*pcVar15 - 0x21U) & 0x1f) & 1) == 0)
                      goto LAB_001acc47;
                    }
                    if (cVar10 != curi_status_success) {
                      return curi_status_canceled;
                    }
                  } while( true );
                }
                if (cVar10 != curi_status_error) {
                  return curi_status_canceled;
                }
                pcVar25 = uri + uVar13;
                if (len <= uVar13) {
                  pcVar25 = "";
                }
                *offset = (long)pvVar23 + 5U;
                bVar5 = *pcVar25;
                pcVar25 = (char *)(ulong)bVar5;
                if ((pcVar25 < (curi_settings *)0x3e) &&
                   ((0x28001fd200000000U >> ((ulong)pcVar25 & 0x3f) & 1) != 0)) goto LAB_001acba9;
                if (bVar5 == 0x3a) {
                  uVar13 = (long)pvVar23 + 5U;
                }
                *offset = uVar13;
                if (bVar5 == 0x3a) goto LAB_001acba9;
              }
            }
          }
          goto LAB_001acc5e;
        }
      }
      else if (cVar11 == curi_status_success) {
        sVar21 = *offset;
        cVar11 = parse_h16_and_colon(uri,len,offset,pcVar16,userData_00);
        if (cVar11 == curi_status_success) {
          cVar11 = parse_h16(uri,len,offset,pcVar16,userData_00);
        }
        if (cVar11 == curi_status_error) {
          *offset = sVar21;
          cVar11 = parse_IPv4address(uri,len,offset,pcVar16,userData_00);
          if (cVar11 == curi_status_error) goto LAB_001acad0;
        }
      }
    }
    else {
      *offset = (size_t)pcVar3;
      cVar10 = parse_h16_and_colon(uri,len,offset,pcVar14,userData_00);
      lVar20 = 6;
      do {
        sVar21 = *offset;
        cVar11 = parse_h16_and_colon(uri,len,offset,pcVar16,userData_00);
        if (cVar11 == curi_status_error) {
          *offset = sVar21;
          cVar11 = cVar10;
        }
        lVar20 = lVar20 + -1;
        cVar10 = cVar11;
      } while (lVar20 != 0);
      if (cVar11 == curi_status_error) goto LAB_001aca2b;
      if (cVar11 == curi_status_success) {
        pcVar16 = (curi_settings *)*offset;
        goto LAB_001aca15;
      }
    }
    pcVar25 = (char *)pcVar16;
    if (cVar11 == curi_status_success) {
      uVar13 = *offset;
      userData_00 = (void *)(uVar13 + 1);
LAB_001acc47:
      pcVar15 = uri + uVar13;
      if (len <= uVar13) {
        pcVar15 = "";
      }
      *offset = (size_t)userData_00;
      if (*pcVar15 == ']') goto LAB_001acd06;
      goto LAB_001acc5e;
    }
  }
  else {
LAB_001acc5e:
    *offset = (size_t)pvVar23;
    cVar11 = parse_IPv4address(uri,len,offset,(curi_settings *)pcVar25,userData_00);
    pvVar22 = pvVar23;
    if (cVar11 == curi_status_error) {
switchD_001accb1_caseD_21:
      userData_00 = pvVar22;
      pcVar25 = uri + (long)userData_00;
      if (len <= userData_00) {
        pcVar25 = "";
      }
      pvVar22 = (void *)((long)userData_00 + 1);
      *offset = (size_t)pvVar22;
      switch(*pcVar25) {
      case '!':
      case '$':
      case '&':
      case '\'':
      case '(':
      case ')':
      case '*':
      case '+':
      case ',':
      case '-':
      case '.':
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
      case ';':
      case '=':
      case 'A':
      case 'B':
      case 'C':
      case 'D':
      case 'E':
      case 'F':
      case 'G':
      case 'H':
      case 'I':
      case 'J':
      case 'K':
      case 'L':
      case 'M':
      case 'N':
      case 'O':
      case 'P':
      case 'Q':
      case 'R':
      case 'S':
      case 'T':
      case 'U':
      case 'V':
      case 'W':
      case 'X':
      case 'Y':
      case 'Z':
      case '_':
      case 'a':
      case 'b':
      case 'c':
      case 'd':
      case 'e':
      case 'f':
      case 'g':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'l':
      case 'm':
      case 'n':
      case 'o':
      case 'p':
      case 'q':
      case 'r':
      case 's':
      case 't':
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case 'z':
      case '~':
        goto switchD_001accb1_caseD_21;
      default:
        goto switchD_001accb1_caseD_22;
      case '%':
        pcVar25 = uri + (long)pvVar22;
        if (len <= pvVar22) {
          pcVar25 = "";
        }
        uVar13 = (long)userData_00 + 2;
        *offset = uVar13;
        if ((0x36 < (byte)*pcVar25 - 0x30) ||
           ((0x7e0000007e03ffU >> ((ulong)((byte)*pcVar25 - 0x30) & 0x3f) & 1) == 0))
        goto switchD_001accb1_caseD_22;
        pcVar25 = uri + uVar13;
        if (len <= uVar13) {
          pcVar25 = "";
        }
        *offset = (long)userData_00 + 3U;
        if ((0x36 < (byte)*pcVar25 - 0x30) ||
           (pvVar22 = (void *)((long)userData_00 + 3U),
           (0x7e0000007e03ffU >> ((ulong)((byte)*pcVar25 - 0x30) & 0x3f) & 1) == 0))
        goto switchD_001accb1_caseD_22;
        goto switchD_001accb1_caseD_21;
      }
    }
  }
  if (cVar11 == curi_status_success) {
    userData_00 = (void *)*offset;
    goto LAB_001acd06;
  }
LAB_001acd5b:
  if (cVar11 == curi_status_success) {
    userData_00 = (void *)*offset;
    goto LAB_001acd6c;
  }
LAB_001ace83:
  if (cVar11 == curi_status_error) goto LAB_001ace93;
  goto LAB_001aceb0;
switchD_001accb1_caseD_22:
  *offset = (size_t)userData_00;
LAB_001acd06:
  sVar21 = (long)userData_00 - (long)pvVar23;
  p_Var6 = settings->host_callback;
  if (settings->url_decode != 0) {
    userData_00 = userData;
    cVar11 = handle_str_callback_url_decoded(p_Var6,(char *)pcVar18,sVar21,settings,userData);
    goto LAB_001acd5b;
  }
  if (p_Var6 != (_func_int_void_ptr_char_ptr_size_t *)0x0 && userData_00 != pvVar23) {
    iVar9 = (*p_Var6)(userData,(char *)pcVar18,sVar21);
    cVar11 = (curi_status)(iVar9 == 0);
    goto LAB_001acd5b;
  }
LAB_001acd6c:
  pcVar25 = uri + (long)userData_00;
  if (len <= userData_00) {
    pcVar25 = "";
  }
  uVar13 = (long)userData_00 + 1;
  *offset = uVar13;
  if (*pcVar25 == ':') {
    pcVar25 = uri + uVar13;
    pcVar15 = "";
    if (uVar13 < len) {
      pcVar15 = pcVar25;
    }
    if ((byte)(*pcVar15 - 0x30U) < 10) {
      sVar21 = 0;
      do {
        uVar13 = (long)userData_00 + sVar21 + 2;
        *offset = uVar13;
        pcVar15 = uri + (long)userData_00 + sVar21 + 2;
        if (len <= uVar13) {
          pcVar15 = "";
        }
        sVar21 = sVar21 + 1;
      } while ((byte)(*pcVar15 - 0x30U) < 10);
      bVar26 = false;
      if (settings->portStr_callback != (_func_int_void_ptr_char_ptr_size_t *)0x0 && sVar21 != 0) {
        iVar9 = (*settings->portStr_callback)(userData,pcVar25,sVar21);
        bVar26 = iVar9 == 0;
      }
      if ((sVar21 != 0) && (!bVar26)) {
        p_Var7 = settings->port_callback;
        if (p_Var7 == (_func_int_void_ptr_uint *)0x0) goto LAB_001ace49;
        uVar12 = atoi(pcVar25);
        iVar9 = (*p_Var7)(userData,uVar12);
        bVar26 = iVar9 == 0;
      }
      if (bVar26) {
        return curi_status_canceled;
      }
    }
  }
  else {
    *offset = (size_t)userData_00;
  }
LAB_001ace49:
  sVar21 = *offset;
  userData_00 = userData;
  cVar11 = parse_segments(uri,len,offset,settings,userData);
  if (cVar11 == curi_status_success) {
    cVar11 = handle_path(uri + sVar21,*offset - sVar21,settings,userData);
    goto LAB_001ace83;
  }
  goto LAB_001aceb0;
switchD_001ac7f3_caseD_2c:
  *offset = uVar13;
  if (settings->scheme_callback != (_func_int_void_ptr_char_ptr_size_t *)0x0 && lVar20 != 0) {
    iVar9 = (*settings->scheme_callback)(userData,uri + uVar24,-lVar20);
    if (iVar9 == 0) {
      return curi_status_canceled;
    }
    uVar13 = *offset;
  }
  uVar24 = uVar13 + 1;
  pcVar25 = uri + uVar13;
  if (len <= uVar13) {
    pcVar25 = "";
  }
  *offset = uVar24;
  if (*pcVar25 != ':') {
    return curi_status_error;
  }
  pcVar25 = uri + uVar24;
  if (len <= uVar24) {
    pcVar25 = "";
  }
  uVar1 = uVar13 + 2;
  *offset = uVar1;
  if (*pcVar25 == '/') {
    pcVar25 = uri + uVar1;
    if (len <= uVar1) {
      pcVar25 = "";
    }
    pvVar23 = (void *)(uVar13 + 3);
    *offset = (size_t)pvVar23;
    pvVar22 = pvVar23;
    if (*pcVar25 == '/') {
switchD_001ac8de_caseD_21:
      userData_00 = pvVar22;
      pcVar25 = uri + (long)userData_00;
      if (len <= userData_00) {
        pcVar25 = "";
      }
      pvVar2 = (void *)((long)userData_00 + 1);
      *offset = (size_t)pvVar2;
      pvVar22 = pvVar2;
      switch(*pcVar25) {
      case '!':
      case '$':
      case '&':
      case '\'':
      case '(':
      case ')':
      case '*':
      case '+':
      case ',':
      case '-':
      case '.':
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
      case ':':
      case ';':
      case '=':
      case 'A':
      case 'B':
      case 'C':
      case 'D':
      case 'E':
      case 'F':
      case 'G':
      case 'H':
      case 'I':
      case 'J':
      case 'K':
      case 'L':
      case 'M':
      case 'N':
      case 'O':
      case 'P':
      case 'Q':
      case 'R':
      case 'S':
      case 'T':
      case 'U':
      case 'V':
      case 'W':
      case 'X':
      case 'Y':
      case 'Z':
      case '_':
      case 'a':
      case 'b':
      case 'c':
      case 'd':
      case 'e':
      case 'f':
      case 'g':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'l':
      case 'm':
      case 'n':
      case 'o':
      case 'p':
      case 'q':
      case 'r':
      case 's':
      case 't':
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case 'z':
      case '~':
        goto switchD_001ac8de_caseD_21;
      default:
        goto switchD_001ac8de_caseD_22;
      case '%':
        pcVar15 = uri + (long)pvVar2;
        if (len <= pvVar2) {
          pcVar15 = "";
        }
        uVar13 = (long)userData_00 + 2;
        *offset = uVar13;
        if ((0x36 < (byte)*pcVar15 - 0x30) ||
           ((0x7e0000007e03ffU >> ((ulong)((byte)*pcVar15 - 0x30) & 0x3f) & 1) == 0))
        goto switchD_001ac8de_caseD_22;
        pcVar15 = uri + uVar13;
        if (len <= uVar13) {
          pcVar15 = "";
        }
        *offset = (long)userData_00 + 3U;
        if ((0x36 < (byte)*pcVar15 - 0x30) ||
           (pvVar22 = (void *)((long)userData_00 + 3U),
           (0x7e0000007e03ffU >> ((ulong)((byte)*pcVar15 - 0x30) & 0x3f) & 1) == 0))
        goto switchD_001ac8de_caseD_22;
        goto switchD_001ac8de_caseD_21;
      }
    }
  }
LAB_001ace93:
  *offset = uVar24;
  userData_00 = userData;
  cVar11 = parse_path(uri,len,offset,settings,userData);
LAB_001aceb0:
  pcVar18 = settings;
  if (cVar11 == curi_status_success) {
    sVar21 = *offset;
    userData_00 = userData;
    cVar11 = parse_query(uri,len,offset,settings,userData,1);
    if (cVar11 == curi_status_error) goto LAB_001acee0;
  }
  if (cVar11 != curi_status_success) {
    return cVar11;
  }
  sVar21 = *offset;
LAB_001acee0:
  pcVar25 = "";
  if (sVar21 < len) {
    pcVar25 = uri + sVar21;
  }
  sVar4 = sVar21 + 1;
  *offset = sVar4;
  if (*pcVar25 == '#') {
    do {
      sVar8 = *offset;
      cVar10 = parse_query_fragment_char(uri,len,offset,pcVar18,userData_00);
    } while (cVar10 == curi_status_success);
    *offset = sVar8;
    p_Var6 = settings->fragment_callback;
    if (settings->url_decode == 0) {
      if (p_Var6 != (_func_int_void_ptr_char_ptr_size_t *)0x0 && sVar8 != sVar4) {
        iVar9 = (*p_Var6)(userData,uri + sVar4,sVar8 - sVar4);
        return (uint)(iVar9 == 0);
      }
      return curi_status_success;
    }
    cVar10 = handle_str_callback_url_decoded(p_Var6,uri + sVar4,sVar8 - sVar4,settings,userData);
    if (cVar10 != curi_status_error) {
      return cVar10;
    }
  }
  *offset = sVar21;
  return curi_status_success;
}

Assistant:

static curi_status parse_full_uri(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // URI = scheme ":" hier-part [ query ] [ fragment ]
    curi_status status = curi_status_success;

    if (status == curi_status_success)
        status = parse_scheme(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_char(':', uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_hier_part(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        TRY(status, offset, parse_query(uri, len, offset, settings, userData, 1));

    if (status == curi_status_success)
        TRY(status, offset, parse_fragment(uri, len, offset, settings, userData));

    return status;
}